

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int generate_by_descriptor_multisig
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,int flag,
              uchar *script,size_t script_len,size_t *write_len)

{
  uchar *puVar1;
  size_t sVar2;
  miniscript_node_t *pmVar3;
  int iVar4;
  uint uVar5;
  void *__base;
  miniscript_node_t **ppmVar6;
  ulong uVar7;
  long lVar8;
  miniscript_node_t **ppmVar9;
  long lVar10;
  void *__src;
  size_t child_write_len;
  ulong local_60;
  size_t offset;
  long local_50;
  uchar *local_48;
  size_t local_40;
  miniscript_node_t *local_38;
  
  child_write_len = 0;
  pmVar3 = node->child;
  local_40 = 0x208;
  if (script_len < 0x208) {
    local_40 = script_len;
  }
  iVar4 = -2;
  if ((pmVar3 != (miniscript_node_t *)0x0) &&
     ((parent == (miniscript_node_t *)0x0 || (parent->info != (miniscript_item_t *)0x0)))) {
    iVar4 = generate_script_from_miniscript(pmVar3,node,derive_child_num,script,script_len,&offset);
    if (iVar4 == 0) {
      uVar5 = 0;
      ppmVar9 = &pmVar3->next;
      for (ppmVar6 = ppmVar9; *ppmVar6 != (miniscript_node_t *)0x0; ppmVar6 = &(*ppmVar6)->next) {
        uVar5 = uVar5 + 1;
      }
      local_50 = CONCAT44(local_50._4_4_,flag);
      local_60 = (ulong)uVar5;
      __base = wally_malloc(local_60 * 0x50);
      if (__base == (void *)0x0) {
        iVar4 = -3;
      }
      else {
        uVar5 = 0;
        while (pmVar3 = *ppmVar9, pmVar3 != (miniscript_node_t *)0x0) {
          *(miniscript_node_t **)((long)__base + (ulong)uVar5 * 0x50) = pmVar3;
          uVar5 = uVar5 + 1;
          ppmVar9 = &pmVar3->next;
        }
        lVar8 = local_60 * 0x50;
        local_48 = script;
        local_38 = parent;
        for (lVar10 = 0; lVar8 - lVar10 != 0; lVar10 = lVar10 + 0x50) {
          child_write_len = 0;
          iVar4 = generate_script_from_miniscript
                            (*(miniscript_node_t **)((long)__base + lVar10),node,derive_child_num,
                             (uchar *)((long)__base + lVar10 + 8),0x41,&child_write_len);
          if (iVar4 != 0) goto LAB_00168889;
          *(undefined4 *)((long)__base + lVar10 + 0x4c) = (undefined4)child_write_len;
        }
        if ((int)local_50 == 8) {
          qsort(__base,local_60,0x50,compare_multisig_node);
        }
        local_50 = local_60 * 0x50;
        for (lVar8 = 0; sVar2 = offset, local_50 != lVar8; lVar8 = lVar8 + 0x50) {
          uVar7 = (ulong)*(uint *)((long)__base + lVar8 + 0x4c);
          if (local_40 < offset + uVar7 + 1) goto LAB_00168889;
          puVar1 = local_48 + offset;
          __src = (void *)((long)__base + lVar8 + 8);
          memcpy(puVar1 + 1,__src,uVar7);
          *puVar1 = *(uchar *)((long)__src + 0x44);
          offset = sVar2 + (*(int *)((long)__src + 0x44) + 1);
        }
        iVar4 = generate_script_from_number
                          (local_60,local_38,local_48 + offset,local_40 - offset,&child_write_len);
        if (iVar4 == 0) {
          sVar2 = offset + child_write_len;
          uVar7 = child_write_len + offset + 1;
          offset = sVar2;
          if (uVar7 <= local_40) {
            local_48[sVar2] = 0xae;
            *write_len = uVar7;
          }
        }
LAB_00168889:
        wally_free(__base);
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static int generate_by_descriptor_multisig(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    int flag,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;
    size_t child_write_len = 0;
    size_t offset;
    uint32_t count = 0;
    uint32_t index = 0;
    struct miniscript_node_t *child = node->child;
    struct miniscript_node_t *temp_node;
    struct multisig_sort_data_t *sorted_node_array;
    size_t check_len = (DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE > script_len) ? script_len : DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE;

    if (!child || (parent && !parent->info))
        return WALLY_EINVAL;

    ret = generate_script_from_miniscript(child, node, derive_child_num, script, script_len, &offset);
    if (ret != WALLY_OK)
        return ret;

    temp_node = child->next;
    while (temp_node != NULL) {
        ++count;
        temp_node = temp_node->next;
    }

    sorted_node_array = (struct multisig_sort_data_t *)wally_malloc(
        count * sizeof(struct multisig_sort_data_t));
    if (!sorted_node_array)
        return WALLY_ENOMEM;

    temp_node = child->next;
    while (temp_node != NULL) {
        sorted_node_array[index].node = temp_node;
        ++index;
        temp_node = temp_node->next;
    }

    if (ret == WALLY_OK) {
        for (index = 0; index < count; ++index) {
            child_write_len = 0;
            ret = generate_script_from_miniscript(
                sorted_node_array[index].node, node, derive_child_num,
                sorted_node_array[index].script,
                sizeof(sorted_node_array[index].script),
                &child_write_len);
            if (ret != WALLY_OK)
                break;
            sorted_node_array[index].script_size = (uint32_t)child_write_len;
        }
    }
    if (ret == WALLY_OK) {
        if (flag == WALLY_SCRIPT_MULTISIG_SORTED) {
            qsort(sorted_node_array, count, sizeof(struct multisig_sort_data_t),
                  compare_multisig_node);
        }
        for (index = 0; index < count; ++index) {
            if (offset + sorted_node_array[index].script_size + 1 > check_len) {
                ret = WALLY_EINVAL;
                break;
            }

            memcpy(&script[offset + 1], sorted_node_array[index].script,
                   sorted_node_array[index].script_size);
            script[offset] = (unsigned char) sorted_node_array[index].script_size;
            offset += sorted_node_array[index].script_size + 1;
        }
    }

    if (ret == WALLY_OK) {
        ret = generate_script_from_number((int64_t)count, parent, &script[offset],
                                          check_len - offset, &child_write_len);
    }

    if (ret == WALLY_OK) {
        offset += child_write_len;
        if (offset + 1 > check_len) {
            ret = WALLY_EINVAL;
        } else {
            script[offset] = OP_CHECKMULTISIG;
            *write_len = offset + 1;
        }
    }
    wally_free(sorted_node_array);
    return WALLY_OK;
}